

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O0

bool __thiscall CService::GetSockAddr(CService *this,sockaddr *paddr,socklen_t *addrlen)

{
  long lVar1;
  bool bVar2;
  uint16_t uVar3;
  in6_addr *in_RDX;
  CNetAddr *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  sockaddr_in6 *paddrin6;
  sockaddr_in *paddrin;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  CNetAddr *pCVar4;
  bool local_9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = CNetAddr::IsIPv4((CNetAddr *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8)
                          );
  if (bVar2) {
    if ((in_RDX->__in6_u).__u6_addr32[0] < 0x10) {
      local_9 = false;
    }
    else {
      (in_RDX->__in6_u).__u6_addr32[0] = 0x10;
      pCVar4 = in_RSI;
      memset(in_RSI,0,(ulong)(in_RDX->__in6_u).__u6_addr32[0]);
      bVar2 = CNetAddr::GetInAddr(pCVar4,(in_addr *)in_RDX);
      if (bVar2) {
        *(undefined2 *)&(in_RSI->m_addr)._union = 2;
        uVar3 = htons(*(uint16_t *)(in_RDI + 0x20));
        *(uint16_t *)((long)&(in_RSI->m_addr)._union + 2) = uVar3;
        local_9 = true;
      }
      else {
        local_9 = false;
      }
    }
  }
  else {
    bVar2 = CNetAddr::IsIPv6((CNetAddr *)
                             CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
    if (!bVar2) {
      bVar2 = CNetAddr::IsCJDNS((CNetAddr *)
                                CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
      if (!bVar2) {
        local_9 = false;
        goto LAB_01980682;
      }
    }
    if ((in_RDX->__in6_u).__u6_addr32[0] < 0x1c) {
      local_9 = false;
    }
    else {
      (in_RDX->__in6_u).__u6_addr32[0] = 0x1c;
      pCVar4 = in_RSI;
      memset(in_RSI,0,(ulong)(in_RDX->__in6_u).__u6_addr32[0]);
      bVar2 = CNetAddr::GetIn6Addr(pCVar4,in_RDX);
      if (bVar2) {
        in_RSI->m_net = *(Network *)(in_RDI + 0x1c);
        *(undefined2 *)&(in_RSI->m_addr)._union = 10;
        uVar3 = htons(*(uint16_t *)(in_RDI + 0x20));
        *(uint16_t *)((long)&(in_RSI->m_addr)._union + 2) = uVar3;
        local_9 = true;
      }
      else {
        local_9 = false;
      }
    }
  }
LAB_01980682:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_9;
  }
  __stack_chk_fail();
}

Assistant:

bool CService::GetSockAddr(struct sockaddr* paddr, socklen_t *addrlen) const
{
    if (IsIPv4()) {
        if (*addrlen < (socklen_t)sizeof(struct sockaddr_in))
            return false;
        *addrlen = sizeof(struct sockaddr_in);
        struct sockaddr_in *paddrin = (struct sockaddr_in*)paddr;
        memset(paddrin, 0, *addrlen);
        if (!GetInAddr(&paddrin->sin_addr))
            return false;
        paddrin->sin_family = AF_INET;
        paddrin->sin_port = htons(port);
        return true;
    }
    if (IsIPv6() || IsCJDNS()) {
        if (*addrlen < (socklen_t)sizeof(struct sockaddr_in6))
            return false;
        *addrlen = sizeof(struct sockaddr_in6);
        struct sockaddr_in6 *paddrin6 = (struct sockaddr_in6*)paddr;
        memset(paddrin6, 0, *addrlen);
        if (!GetIn6Addr(&paddrin6->sin6_addr))
            return false;
        paddrin6->sin6_scope_id = m_scope_id;
        paddrin6->sin6_family = AF_INET6;
        paddrin6->sin6_port = htons(port);
        return true;
    }
    return false;
}